

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::vector<short,std::allocator<short>>,void>
               (vector<short,_std::allocator<short>_> *container,ostream *os)

{
  pointer psVar1;
  long lVar2;
  pointer value;
  
  std::operator<<(os,'{');
  value = (container->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_start;
  psVar1 = (container->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (value == psVar1) {
      if (lVar2 != 0) {
LAB_001cbbbc:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001cbbbc;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<short,void,std::ostream&>(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }